

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

void __thiscall
kj::ArrayBuilder<kj::_::ArrayJoinPromiseNodeBase::Branch>::~ArrayBuilder
          (ArrayBuilder<kj::_::ArrayJoinPromiseNodeBase::Branch> *this)

{
  Branch *pBVar1;
  RemoveConst<kj::_::ArrayJoinPromiseNodeBase::Branch> *pRVar2;
  Branch *pBVar3;
  
  pBVar1 = this->ptr;
  if (pBVar1 != (Branch *)0x0) {
    pRVar2 = this->pos;
    pBVar3 = this->endPtr;
    this->ptr = (Branch *)0x0;
    this->pos = (RemoveConst<kj::_::ArrayJoinPromiseNodeBase::Branch> *)0x0;
    this->endPtr = (Branch *)0x0;
    (*(code *)**(undefined8 **)this->disposer)
              (this->disposer,pBVar1,0x58,((long)pRVar2 - (long)pBVar1 >> 3) * 0x2e8ba2e8ba2e8ba3,
               ((long)pBVar3 - (long)pBVar1 >> 3) * 0x2e8ba2e8ba2e8ba3,
               ArrayDisposer::Dispose_<kj::_::ArrayJoinPromiseNodeBase::Branch>::destruct);
    return;
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    T* posCopy = pos;
    T* endCopy = endPtr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      pos = nullptr;
      endPtr = nullptr;
      disposer->dispose(ptrCopy, posCopy - ptrCopy, endCopy - ptrCopy);
    }
  }